

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

void Acec_ManCecSetDefaultParams(Acec_ParCec_t *p)

{
  p->nBTLimit = 1000;
  p->fBooth = 0;
  p->fSilent = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  p->TimeLimit = 0;
  p->fMiter = 0;
  p->fDualOutput = 0;
  p->fTwoOutput = 0;
  p->iOutFail = -1;
  return;
}

Assistant:

void Acec_ManCecSetDefaultParams( Acec_ParCec_t * p )
{
    memset( p, 0, sizeof(Acec_ParCec_t) );
    p->nBTLimit       =    1000;    // conflict limit at a node
    p->TimeLimit      =       0;    // the runtime limit in seconds
    p->fMiter         =       0;    // input circuit is a miter
    p->fDualOutput    =       0;    // dual-output miter
    p->fTwoOutput     =       0;    // two-output miter
    p->fSilent        =       0;    // print no messages
    p->fVeryVerbose   =       0;    // verbose stats
    p->fVerbose       =       0;    // verbose stats
    p->iOutFail       =      -1;    // the number of failed output
}